

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzrot::ArchiveIN(ChNodeFEAxyzrot *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChNodeFEAxyzrot *)(this[-1].Torque.m_data + 2),in_RSI);
  return;
}

Assistant:

void ChNodeFEAxyzrot::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAxyzrot>();
    // deserialize parent class
    ChNodeFEAbase::ArchiveIN(marchive);
    // serialize parent class
    ChBodyFrame::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(X0);
    marchive >> CHNVP(Force);
    marchive >> CHNVP(Torque);
}